

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImGuiWindow *pIVar6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined3 in_register_00000011;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  ImVec2 IVar13;
  undefined1 auVar15 [16];
  
  IVar3 = *r_min;
  IVar13 = *r_max;
  auVar14._8_8_ = 0;
  auVar14._0_4_ = IVar13.x;
  auVar14._4_4_ = IVar13.y;
  if (CONCAT31(in_register_00000011,clip) != 0) {
    pIVar6 = GImGui->CurrentWindow;
    IVar13 = (pIVar6->ClipRect).Min;
    fVar17 = IVar13.x;
    fVar18 = IVar13.y;
    uVar9 = -(uint)(fVar17 <= IVar3.x);
    uVar11 = -(uint)(fVar18 <= IVar3.y);
    IVar3 = (ImVec2)(CONCAT44((uint)IVar3.y & uVar11,(uint)IVar3.x & uVar9) |
                    CONCAT44(~uVar11 & (uint)fVar18,~uVar9 & (uint)fVar17));
    auVar7._8_8_ = 0;
    auVar7._0_4_ = (pIVar6->ClipRect).Max.x;
    auVar7._4_4_ = (pIVar6->ClipRect).Max.y;
    auVar14 = minps(auVar14,auVar7);
    IVar13 = auVar14._0_8_;
  }
  fVar17 = (GImGui->Style).TouchExtraPadding.x;
  fVar18 = (GImGui->IO).MousePos.x;
  if (IVar3.x - fVar17 <= fVar18) {
    fVar1 = (GImGui->Style).TouchExtraPadding.y;
    fVar2 = (GImGui->IO).MousePos.y;
    if (((IVar3.y - fVar1 <= fVar2) && (fVar18 < fVar17 + IVar13.x)) && (fVar2 < fVar1 + IVar13.y))
    {
      IVar4 = (GImGui->MouseViewport->super_ImGuiViewport).Pos;
      IVar5 = (GImGui->MouseViewport->super_ImGuiViewport).Size;
      fVar17 = IVar4.x;
      fVar18 = IVar4.y;
      iVar10 = -(uint)(IVar3.x < IVar5.x + fVar17);
      iVar12 = -(uint)(IVar3.y < IVar5.y + fVar18);
      auVar16._4_4_ = iVar12;
      auVar16._0_4_ = iVar10;
      auVar16._8_4_ = iVar12;
      auVar16._12_4_ = iVar12;
      auVar15._8_8_ = auVar16._8_8_;
      auVar15._4_4_ = iVar10;
      auVar15._0_4_ = iVar10;
      uVar8 = movmskpd((int)GImGui,auVar15);
      return (bool)(fVar17 < IVar13.x & (byte)uVar8 >> 1 & fVar18 < IVar13.y & (byte)uVar8);
    }
  }
  return false;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    if (!g.MouseViewport->GetRect().Overlaps(rect_clipped))
        return false;
    return true;
}